

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseEditHistoryNext(linenoiseState *l,int dir)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int dir_local;
  linenoiseState *l_local;
  
  if (1 < history_len) {
    free(history[(history_len + -1) - l->history_index]);
    pcVar1 = strdup(l->buf);
    history[(history_len + -1) - l->history_index] = pcVar1;
    iVar3 = -1;
    if (dir == 1) {
      iVar3 = 1;
    }
    l->history_index = iVar3 + l->history_index;
    if (l->history_index < 0) {
      l->history_index = 0;
    }
    else if (l->history_index < history_len) {
      strncpy(l->buf,history[(history_len + -1) - l->history_index],l->buflen);
      l->buf[l->buflen - 1] = '\0';
      sVar2 = strlen(l->buf);
      l->pos = sVar2;
      l->len = sVar2;
      linenoiseRefreshLine();
    }
    else {
      l->history_index = history_len + -1;
    }
  }
  return;
}

Assistant:

void linenoiseEditHistoryNext(struct linenoiseState *l, int dir) {
    if (history_len > 1) {
        /* Update the current history entry before to
         * overwrite it with the next one. */
        free(history[history_len - 1 - l->history_index]);
        history[history_len - 1 - l->history_index] = strdup(l->buf);
        /* Show the new entry */
        l->history_index += (dir == LINENOISE_HISTORY_PREV) ? 1 : -1;
        if (l->history_index < 0) {
            l->history_index = 0;
            return;
        } else if (l->history_index >= history_len) {
            l->history_index = history_len-1;
            return;
        }
        strncpy(l->buf,history[history_len - 1 - l->history_index],l->buflen);
        l->buf[l->buflen-1] = '\0';
        l->len = l->pos = strlen(l->buf);
        linenoiseRefreshLine();
    }
}